

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array.cpp
# Opt level: O2

void f1(int *a)

{
  ostream *poVar1;
  long lVar2;
  scoped_lock l;
  
  spin_mutex_t::lock(&my_io_mutex);
  poVar1 = std::operator<<((ostream *)&std::cerr,"f1 ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*a);
  std::operator<<(poVar1," begin: ");
  lVar2 = std::chrono::_V2::system_clock::now();
  poVar1 = std::ostream::_M_insert<double>((double)(lVar2 - (long)t0.__d.__r) / 1000000000.0);
  std::endl<char,std::char_traits<char>>(poVar1);
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  *a = *a + 1;
  fun(true,600);
  spin_mutex_t::lock(&my_io_mutex);
  poVar1 = std::operator<<((ostream *)&std::cerr,"f1 ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*a);
  std::operator<<(poVar1," end: ");
  lVar2 = std::chrono::_V2::system_clock::now();
  poVar1 = std::ostream::_M_insert<double>((double)(lVar2 - (long)t0.__d.__r) / 1000000000.0);
  std::endl<char,std::char_traits<char>>(poVar1);
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  LOCK();
  x.super___atomic_base<int>._M_i = (__atomic_base<int>)((int)x.super___atomic_base<int>._M_i + 1);
  UNLOCK();
  return;
}

Assistant:

void f1(int a[10])
{ 
  LOG("f1 " << a[0] << " begin: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count()); 
  a[0]++;
  fun(true);
  LOG("f1 " << a[0] << " end: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count());
  x.fetch_add(1);
}